

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O0

void __thiscall
CoreML::TreeEnsembleClassifier::setOutputClassList
          (TreeEnsembleClassifier *this,vector<long,_std::allocator<long>_> *classes)

{
  element_type *peVar1;
  TreeEnsembleClassifier *pTVar2;
  Int64Vector *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  ulong local_20;
  size_t i;
  vector<long,_std::allocator<long>_> *classes_local;
  TreeEnsembleClassifier *this_local;
  
  peVar1 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
  pTVar2 = Specification::Model::mutable_treeensembleclassifier(peVar1);
  pIVar3 = Specification::TreeEnsembleClassifier::mutable_int64classlabels(pTVar2);
  Specification::Int64Vector::clear_vector(pIVar3);
  local_20 = 0;
  while( true ) {
    sVar4 = std::vector<long,_std::allocator<long>_>::size(classes);
    if (sVar4 <= local_20) break;
    peVar1 = std::
             __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_TreeEnsembleBase).super_Model.m_spec);
    pTVar2 = Specification::Model::mutable_treeensembleclassifier(peVar1);
    pIVar3 = Specification::TreeEnsembleClassifier::mutable_int64classlabels(pTVar2);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](classes,local_20);
    Specification::Int64Vector::add_vector(pIVar3,*pvVar5);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::setOutputClassList(const std::vector<int64_t>& classes) {
        m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->clear_vector();
        for(size_t i = 0; i < classes.size(); ++i) {
            m_spec->mutable_treeensembleclassifier()->mutable_int64classlabels()->add_vector(classes[i]);
        }
    }